

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

void JS_DumpMemoryUsage(FILE *fp,JSMemoryUsage *s,JSRuntime *rt)

{
  uint32_t uVar1;
  size_t sVar2;
  char *pcVar3;
  long in_RDX;
  long *in_RSI;
  FILE *in_RDI;
  char buf [64];
  JSObject *p_1;
  JSGCObjectHeader *gp;
  list_head *el;
  int class_id;
  int obj_classes [52];
  uint size1;
  void *p;
  uint size;
  int usage_size_ok;
  int i;
  void *in_stack_fffffffffffffe88;
  FILE *__stream;
  undefined4 in_stack_fffffffffffffe90;
  uint uVar4;
  undefined4 in_stack_fffffffffffffe94;
  uint uVar5;
  JSAtom in_stack_fffffffffffffeb8;
  int in_stack_fffffffffffffebc;
  char *in_stack_fffffffffffffec0;
  JSRuntime *in_stack_fffffffffffffec8;
  long local_118;
  uint local_10c;
  uint local_108 [51];
  uint local_3c;
  uint local_34;
  void *local_30;
  uint local_24;
  int local_20;
  uint local_1c;
  long local_18;
  long *local_10;
  FILE *local_8;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  fprintf(in_RDI,"QuickJS memory usage -- 2021-03-27 version, %d-bit, malloc limit: %ld\n\n",0x40,
          in_RSI[1]);
  if (local_18 != 0) {
    local_20 = 0;
    for (local_1c = 0; local_1c < 5; local_1c = local_1c + 1) {
      local_24 = (uint)JS_DumpMemoryUsage::object_types[(int)local_1c].size;
      local_30 = js_malloc_rt((JSRuntime *)
                              CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                              (size_t)in_stack_fffffffffffffe88);
      if (local_30 != (void *)0x0) {
        sVar2 = js_malloc_usable_size_rt
                          ((JSRuntime *)
                           CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                           in_stack_fffffffffffffe88);
        local_34 = (uint)sVar2;
        if (local_24 <= local_34) {
          local_20 = 1;
          fprintf(local_8,"  %3u + %-2u  %s\n",(ulong)local_24,(ulong)(local_34 - local_24),
                  JS_DumpMemoryUsage::object_types[(int)local_1c].name);
        }
        js_free_rt((JSRuntime *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                   in_stack_fffffffffffffe88);
      }
    }
    if (local_20 == 0) {
      fprintf(local_8,"  malloc_usable_size unavailable\n");
    }
    memset(local_108,0,0xd0);
    for (local_118 = *(long *)(local_18 + 0x90); local_118 != local_18 + 0x88;
        local_118 = *(long *)(local_118 + 8)) {
      if ((*(byte *)(local_118 + -4) & 0xf) == 0) {
        uVar1 = min_uint32((uint)*(ushort *)(local_118 + -2),0x33);
        local_108[uVar1] = local_108[uVar1] + 1;
      }
    }
    fprintf(local_8,"\nJSObject classes\n");
    if (local_108[0] != 0) {
      fprintf(local_8,"  %5d  %2.0d %s\n",(ulong)local_108[0],0,"none");
    }
    for (local_10c = 1; (int)local_10c < 0x33; local_10c = local_10c + 1) {
      if (local_108[(int)local_10c] != 0) {
        uVar4 = local_108[(int)local_10c];
        __stream = local_8;
        uVar5 = local_10c;
        pcVar3 = JS_AtomGetStrRT(in_stack_fffffffffffffec8,in_stack_fffffffffffffec0,
                                 in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8);
        fprintf(__stream,"  %5d  %2.0d %s\n",(ulong)uVar4,(ulong)uVar5,pcVar3);
      }
    }
    if (local_3c != 0) {
      fprintf(local_8,"  %5d  %2.0d %s\n",(ulong)local_3c,0,"other");
    }
    fprintf(local_8,"\n");
  }
  fprintf(local_8,"%-20s %8s %8s\n","NAME","COUNT","SIZE");
  if (local_10[3] != 0) {
    fprintf(local_8,"%-20s %8ld %8ld  (%0.1f per block)\n",(double)*local_10 / (double)local_10[3],
            "memory allocated",local_10[3],*local_10);
    fprintf(local_8,"%-20s %8ld %8ld  (%d overhead, %0.1f average slack)\n",
            (double)(*local_10 - local_10[2]) / (double)local_10[4],"memory used",local_10[4],
            local_10[2],8);
  }
  if (local_10[5] != 0) {
    fprintf(local_8,"%-20s %8ld %8ld  (%0.1f per atom)\n",(double)local_10[6] / (double)local_10[5],
            "atoms",local_10[5],local_10[6]);
  }
  if (local_10[7] != 0) {
    fprintf(local_8,"%-20s %8ld %8ld  (%0.1f per string)\n",
            (double)local_10[8] / (double)local_10[7],"strings",local_10[7],local_10[8]);
  }
  if (local_10[9] != 0) {
    fprintf(local_8,"%-20s %8ld %8ld  (%0.1f per object)\n",
            (double)local_10[10] / (double)local_10[9],"objects",local_10[9],local_10[10]);
    fprintf(local_8,"%-20s %8ld %8ld  (%0.1f per object)\n",
            (double)local_10[0xb] / (double)local_10[9],"  properties",local_10[0xb],local_10[0xc]);
    fprintf(local_8,"%-20s %8ld %8ld  (%0.1f per shape)\n",
            (double)local_10[0xe] / (double)local_10[0xd],"  shapes",local_10[0xd],local_10[0xe]);
  }
  if (local_10[0xf] != 0) {
    fprintf(local_8,"%-20s %8ld %8ld\n","bytecode functions",local_10[0xf],local_10[0x10]);
    fprintf(local_8,"%-20s %8ld %8ld  (%0.1f per function)\n",
            (double)local_10[0x11] / (double)local_10[0xf],"  bytecode",local_10[0xf],local_10[0x11]
           );
    if (local_10[0x12] != 0) {
      fprintf(local_8,"%-20s %8ld %8ld  (%0.1f per function)\n",
              (double)local_10[0x13] / (double)local_10[0x12],"  pc2line",local_10[0x12],
              local_10[0x13]);
    }
  }
  if (local_10[0x14] != 0) {
    fprintf(local_8,"%-20s %8ld\n","C functions",local_10[0x14]);
  }
  if ((local_10[0x15] != 0) &&
     (fprintf(local_8,"%-20s %8ld\n","arrays",local_10[0x15]), local_10[0x16] != 0)) {
    fprintf(local_8,"%-20s %8ld\n","  fast arrays",local_10[0x16]);
    fprintf(local_8,"%-20s %8ld %8ld  (%0.1f per fast array)\n",
            (double)local_10[0x17] / (double)local_10[0x16],"  elements",local_10[0x17],
            local_10[0x17] << 4);
  }
  if (local_10[0x18] != 0) {
    fprintf(local_8,"%-20s %8ld %8ld\n","binary objects",local_10[0x18],local_10[0x19]);
  }
  return;
}

Assistant:

void JS_DumpMemoryUsage(FILE *fp, const JSMemoryUsage *s, JSRuntime *rt)
{
    fprintf(fp, "QuickJS memory usage -- "
#ifdef CONFIG_BIGNUM
            "BigNum "
#endif
            CONFIG_VERSION " version, %d-bit, malloc limit: %"PRId64"\n\n",
            (int)sizeof(void *) * 8, (int64_t)(ssize_t)s->malloc_limit);
#if 1
    if (rt) {
        static const struct {
            const char *name;
            size_t size;
        } object_types[] = {
            { "JSRuntime", sizeof(JSRuntime) },
            { "JSContext", sizeof(JSContext) },
            { "JSObject", sizeof(JSObject) },
            { "JSString", sizeof(JSString) },
            { "JSFunctionBytecode", sizeof(JSFunctionBytecode) },
        };
        int i, usage_size_ok = 0;
        for(i = 0; i < countof(object_types); i++) {
            unsigned int size = object_types[i].size;
            void *p = js_malloc_rt(rt, size);
            if (p) {
                unsigned int size1 = js_malloc_usable_size_rt(rt, p);
                if (size1 >= size) {
                    usage_size_ok = 1;
                    fprintf(fp, "  %3u + %-2u  %s\n",
                            size, size1 - size, object_types[i].name);
                }
                js_free_rt(rt, p);
            }
        }
        if (!usage_size_ok) {
            fprintf(fp, "  malloc_usable_size unavailable\n");
        }
        {
            int obj_classes[JS_CLASS_INIT_COUNT + 1] = { 0 };
            int class_id;
            struct list_head *el;
            list_for_each(el, &rt->gc_obj_list) {
                JSGCObjectHeader *gp = list_entry(el, JSGCObjectHeader, link);
                JSObject *p;
                if (gp->gc_obj_type == JS_GC_OBJ_TYPE_JS_OBJECT) {
                    p = (JSObject *)gp;
                    obj_classes[min_uint32(p->class_id, JS_CLASS_INIT_COUNT)]++;
                }
            }
            fprintf(fp, "\n" "JSObject classes\n");
            if (obj_classes[0])
                fprintf(fp, "  %5d  %2.0d %s\n", obj_classes[0], 0, "none");
            for (class_id = 1; class_id < JS_CLASS_INIT_COUNT; class_id++) {
                if (obj_classes[class_id]) {
                    char buf[ATOM_GET_STR_BUF_SIZE];
                    fprintf(fp, "  %5d  %2.0d %s\n", obj_classes[class_id], class_id,
                            JS_AtomGetStrRT(rt, buf, sizeof(buf), js_std_class_def[class_id - 1].class_name));
                }
            }
            if (obj_classes[JS_CLASS_INIT_COUNT])
                fprintf(fp, "  %5d  %2.0d %s\n", obj_classes[JS_CLASS_INIT_COUNT], 0, "other");
        }
        fprintf(fp, "\n");
    }
#endif
    fprintf(fp, "%-20s %8s %8s\n", "NAME", "COUNT", "SIZE");

    if (s->malloc_count) {
        fprintf(fp, "%-20s %8"PRId64" %8"PRId64"  (%0.1f per block)\n",
                "memory allocated", s->malloc_count, s->malloc_size,
                (double)s->malloc_size / s->malloc_count);
        fprintf(fp, "%-20s %8"PRId64" %8"PRId64"  (%d overhead, %0.1f average slack)\n",
                "memory used", s->memory_used_count, s->memory_used_size,
                MALLOC_OVERHEAD, ((double)(s->malloc_size - s->memory_used_size) /
                                  s->memory_used_count));
    }
    if (s->atom_count) {
        fprintf(fp, "%-20s %8"PRId64" %8"PRId64"  (%0.1f per atom)\n",
                "atoms", s->atom_count, s->atom_size,
                (double)s->atom_size / s->atom_count);
    }
    if (s->str_count) {
        fprintf(fp, "%-20s %8"PRId64" %8"PRId64"  (%0.1f per string)\n",
                "strings", s->str_count, s->str_size,
                (double)s->str_size / s->str_count);
    }
    if (s->obj_count) {
        fprintf(fp, "%-20s %8"PRId64" %8"PRId64"  (%0.1f per object)\n",
                "objects", s->obj_count, s->obj_size,
                (double)s->obj_size / s->obj_count);
        fprintf(fp, "%-20s %8"PRId64" %8"PRId64"  (%0.1f per object)\n",
                "  properties", s->prop_count, s->prop_size,
                (double)s->prop_count / s->obj_count);
        fprintf(fp, "%-20s %8"PRId64" %8"PRId64"  (%0.1f per shape)\n",
                "  shapes", s->shape_count, s->shape_size,
                (double)s->shape_size / s->shape_count);
    }
    if (s->js_func_count) {
        fprintf(fp, "%-20s %8"PRId64" %8"PRId64"\n",
                "bytecode functions", s->js_func_count, s->js_func_size);
        fprintf(fp, "%-20s %8"PRId64" %8"PRId64"  (%0.1f per function)\n",
                "  bytecode", s->js_func_count, s->js_func_code_size,
                (double)s->js_func_code_size / s->js_func_count);
        if (s->js_func_pc2line_count) {
            fprintf(fp, "%-20s %8"PRId64" %8"PRId64"  (%0.1f per function)\n",
                    "  pc2line", s->js_func_pc2line_count,
                    s->js_func_pc2line_size,
                    (double)s->js_func_pc2line_size / s->js_func_pc2line_count);
        }
    }
    if (s->c_func_count) {
        fprintf(fp, "%-20s %8"PRId64"\n", "C functions", s->c_func_count);
    }
    if (s->array_count) {
        fprintf(fp, "%-20s %8"PRId64"\n", "arrays", s->array_count);
        if (s->fast_array_count) {
            fprintf(fp, "%-20s %8"PRId64"\n", "  fast arrays", s->fast_array_count);
            fprintf(fp, "%-20s %8"PRId64" %8"PRId64"  (%0.1f per fast array)\n",
                    "  elements", s->fast_array_elements,
                    s->fast_array_elements * (int)sizeof(JSValue),
                    (double)s->fast_array_elements / s->fast_array_count);
        }
    }
    if (s->binary_object_count) {
        fprintf(fp, "%-20s %8"PRId64" %8"PRId64"\n",
                "binary objects", s->binary_object_count, s->binary_object_size);
    }
}